

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O2

int __thiscall Algorithms::mobiusFunction(Algorithms *this,BigInteger *n)

{
  bool bVar1;
  int i;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_> fact;
  BigInteger local_48;
  
  uVar3 = 1;
  BigIntegerLibrary::BigInteger::BigInteger((BigInteger *)&fact,1);
  bVar1 = BigIntegerLibrary::BigInteger::operator==(n,(BigInteger *)&fact);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&fact);
  if (bVar1) {
    uVar2 = 1;
  }
  else {
    BigIntegerLibrary::BigInteger::BigInteger(&local_48,n);
    factorization(&fact,this,&local_48);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_48);
    std::
    __sort<__gnu_cxx::__normal_iterator<BigIntegerLibrary::BigInteger*,std::vector<BigIntegerLibrary::BigInteger,std::allocator<BigIntegerLibrary::BigInteger>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (fact.
               super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
               ._M_impl.super__Vector_impl_data._M_start,
               fact.
               super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    lVar4 = 0;
    while( true ) {
      if ((ulong)((long)fact.
                        super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)fact.
                        super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar3) break;
      bVar1 = BigIntegerLibrary::BigInteger::operator!=
                        ((BigInteger *)
                         ((long)&fact.
                                 super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].num.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar4),
                         (BigInteger *)
                         ((long)&((fact.
                                   super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->num).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar4));
      if (!bVar1) {
        uVar2 = 0;
        goto LAB_00106da1;
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x20;
    }
    uVar2 = -((uint)uVar3 & 1) | 1;
LAB_00106da1:
    std::vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>::
    ~vector(&fact);
  }
  return uVar2;
}

Assistant:

int Algorithms::mobiusFunction(BigInteger n) {
    if (n == BigInteger(1)) {
        return 1;
    }
    auto fact = factorization(n);
    sort(fact.begin(), fact.end());
    int k = 1;
    for (int i = 1; i < fact.size(); ++i) {
        if (fact[i] != fact[i - 1]) {
            ++k;
        } else {
            return 0; // n % fact[i]^2 == 0
        }
    }
    if (k % 2) {
        return -1;
    }
    return 1;
}